

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

xchar dname_to_dnum(char *s,boolean optional)

{
  int iVar1;
  char local_1a;
  xchar i;
  boolean optional_local;
  char *s_local;
  
  local_1a = '\0';
  while( true ) {
    if (n_dgns <= local_1a) {
      if (optional != '\0') {
        return (xchar)n_dgns;
      }
      panic("Couldn\'t resolve dungeon number for name \"%s\".",s);
    }
    iVar1 = strcmp(dungeons[local_1a].dname,s);
    if (iVar1 == 0) break;
    local_1a = local_1a + '\x01';
  }
  return local_1a;
}

Assistant:

static xchar dname_to_dnum(const char *s, boolean optional)
{
	xchar	i;

	for (i = 0; i < n_dgns; i++)
	    if (!strcmp(dungeons[i].dname, s)) return i;

	if (optional)
	    return n_dgns;	/* bogus dnum instead of panicking */

	panic("Couldn't resolve dungeon number for name \"%s\".", s);
	/*NOT REACHED*/
	return (xchar)0;
}